

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<unsigned_long,void,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void,_void> *values,
               ostream *os)

{
  unsigned_long uVar1;
  MatcherInterface<unsigned_long> *pMVar2;
  linked_ptr_internal lVar3;
  int iVar4;
  ostream *poVar5;
  type matcher;
  StringMatchResultListener listener;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_> local_1f8;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8.value_ = (matchers->f0_).super_MatcherBase<unsigned_long>.impl_.value_;
  lVar3.next_ = &local_1f8.link_;
  if (local_1f8.value_ != (MatcherInterface<unsigned_long> *)0x0) {
    linked_ptr_internal::join
              (&local_1f8.link_,&(matchers->f0_).super_MatcherBase<unsigned_long>.impl_.link_);
    lVar3.next_ = local_1f8.link_.next_;
  }
  local_1f8.link_.next_ = lVar3.next_;
  local_1c0 = (undefined1 *)0x0;
  if (asStack_1b8 != (stringstream *)0x0) {
    local_1c0 = local_1a8;
  }
  uVar1 = values->f0_;
  local_1c8 = &PTR__StringMatchResultListener_001d5bf0;
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  iVar4 = (*((local_1f8.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4]
          )(local_1f8.value_,uVar1,&local_1c8);
  if ((char)iVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pMVar2 = (matchers->f0_).super_MatcherBase<unsigned_long>.impl_.value_;
    (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar2,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__cxx11::stringbuf::str();
    iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
    if ((os != (ostream *)0x0) && (iVar4 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_001d5bf0;
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr(&local_1f8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }